

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O0

bool Assimp::SceneCombiner::FindNameMatch
               (aiString *name,
               vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_> *input,uint cur)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  bool local_49;
  _Self local_40;
  _Self local_38;
  uint local_2c;
  uint32_t local_28;
  uint i;
  uint hash;
  uint cur_local;
  vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_> *input_local;
  aiString *name_local;
  
  i = cur;
  _hash = input;
  input_local = (vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_> *)name;
  local_28 = SuperFastHash(name->data,name->length,0);
  local_2c = 0;
  while( true ) {
    uVar1 = (ulong)local_2c;
    sVar2 = std::vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>::size(_hash);
    if (sVar2 <= uVar1) {
      return false;
    }
    local_49 = false;
    if (i != local_2c) {
      pvVar3 = std::vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>::operator[]
                         (_hash,(ulong)local_2c);
      local_38._M_node =
           (_Base_ptr)
           std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::find
                     (&pvVar3->hashes,&local_28);
      pvVar3 = std::vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>::operator[]
                         (_hash,(ulong)local_2c);
      local_40._M_node =
           (_Base_ptr)
           std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                     (&pvVar3->hashes);
      local_49 = std::operator!=(&local_38,&local_40);
    }
    if (local_49 != false) break;
    local_2c = local_2c + 1;
  }
  return true;
}

Assistant:

bool SceneCombiner::FindNameMatch(const aiString& name, std::vector<SceneHelper>& input, unsigned int cur) {
    const unsigned int hash = SuperFastHash(name.data, static_cast<uint32_t>(name.length));

    // Check whether we find a positive match in one of the given sets
    for (unsigned int i = 0; i < input.size(); ++i) {
        if (cur != i && input[i].hashes.find(hash) != input[i].hashes.end()) {
            return true;
        }
    }
    return false;
}